

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O3

bool __thiscall
Js::ByteCodeWriter::TryWriteElementRootCP<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
          (ByteCodeWriter *this,OpCode op,RegSlot value,uint cacheId,bool isLoadMethod,bool isStore)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  undefined8 *puVar4;
  undefined3 in_register_00000081;
  ulong uVar5;
  long lVar6;
  uint uVar7;
  uint local_39;
  undefined1 local_35;
  uint uStack_34;
  OpLayoutT_ElementRootCP<Js::LayoutSizePolicy<(Js::LayoutSize)0>_> layout;
  
  uVar7 = CONCAT31(in_register_00000081,isLoadMethod);
  if (isLoadMethod && isStore) {
    AssertCount = AssertCount + 1;
    uStack_34 = CONCAT31(in_register_00000081,isLoadMethod);
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x75b,"(!isLoadMethod || !isStore)","!isLoadMethod || !isStore");
    if (!bVar2) goto LAB_0089a5a8;
    *puVar3 = 0;
    uVar7 = uStack_34;
  }
  if (((DAT_0159efbd == '\0') && (DAT_0159efbc == '\0')) &&
     (local_35 = (undefined1)value, value < 0x100)) {
    local_39 = cacheId;
    uStack_34 = Data::EncodeT<(Js::LayoutSize)0>(&this->m_byteCodeData,op,this);
    Data::Write(&this->m_byteCodeData,&local_39,5);
    uVar5 = (ulong)uStack_34;
    if (uVar5 + (ulong)(MaxByteSizedOpcodes < op) * 2 + 6 !=
        (ulong)(this->m_byteCodeData).currentOffset) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                  ,0x761,
                                  "(m_byteCodeData.GetCurrentOffset() == offset + OpCodeUtil::EncodedSize(op, SizePolicy::LayoutEnum) + sizeof(OpLayoutT_ElementRootCP<SizePolicy>))"
                                  ,
                                  "m_byteCodeData.GetCurrentOffset() == offset + OpCodeUtil::EncodedSize(op, SizePolicy::LayoutEnum) + sizeof(OpLayoutT_ElementRootCP<SizePolicy>)"
                                 );
      if (!bVar2) {
LAB_0089a5a8:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
    }
    lVar6 = 0x48;
    if (!isStore) {
      lVar6 = (ulong)((uVar7 & 0xff) << 5) + 0x38;
    }
    puVar4 = (undefined8 *)
             new<Memory::ArenaAllocator>
                       (0x10,(this->m_labelOffsets->
                             super_ReadOnlyList<unsigned_int,_Memory::ArenaAllocator,_DefaultComparer>
                             ).alloc,0x364470);
    puVar4[1] = uVar5 + (ulong)(MaxByteSizedOpcodes < op) * 2 + 1;
    *puVar4 = *(undefined8 *)((long)&this->m_labelOffsets + lVar6);
    *(undefined8 **)((long)&this->m_labelOffsets + lVar6) = puVar4;
    *(int *)(&this->useBranchIsland + lVar6) = *(int *)(&this->useBranchIsland + lVar6) + 1;
    bVar2 = true;
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool ByteCodeWriter::TryWriteElementRootCP(OpCode op, RegSlot value, uint cacheId, bool isLoadMethod, bool isStore)
    {
        Assert(!isLoadMethod || !isStore);
        OpLayoutT_ElementRootCP<SizePolicy> layout;
        if (SizePolicy::Assign(layout.Value, value) && SizePolicy::Assign(layout.inlineCacheIndex, cacheId))
        {
            size_t offset = m_byteCodeData.EncodeT<SizePolicy::LayoutEnum>(op, &layout, sizeof(layout), this);

            Assert(m_byteCodeData.GetCurrentOffset() == offset + OpCodeUtil::EncodedSize(op, SizePolicy::LayoutEnum) + sizeof(OpLayoutT_ElementRootCP<SizePolicy>));
            size_t inlineCacheOffset = offset + OpCodeUtil::EncodedSize(op, SizePolicy::LayoutEnum)
                + offsetof(OpLayoutT_ElementRootCP<SizePolicy>, inlineCacheIndex);

            // Root object inline cache index are given out from 0, but it will be at index after
            // all the plain inline cache. Store the offset of the inline cache index to patch it up later.
            SListBase<size_t> * rootObjectInlineCacheOffsets = isStore ?
                &rootObjectStoreInlineCacheOffsets : isLoadMethod ? &rootObjectLoadMethodInlineCacheOffsets : &rootObjectLoadInlineCacheOffsets;
            rootObjectInlineCacheOffsets->Prepend(this->m_labelOffsets->GetAllocator(), inlineCacheOffset);
            return true;
        }
        return false;
    }